

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

Vec_Int_t * Wlc_NtkCleanObjects(Wlc_Ntk_t *p,Vec_Int_t *vObjs)

{
  int iVar1;
  Vec_Int_t *p_00;
  Wlc_Obj_t *pObj_00;
  Vec_Int_t *vMemObjs;
  int i;
  Wlc_Obj_t *pObj;
  Vec_Int_t *vObjs_local;
  Wlc_Ntk_t *p_local;
  
  p_00 = Vec_IntAlloc(10);
  Wlc_NtkSetRefs(p);
  for (vMemObjs._4_4_ = 0; iVar1 = Vec_IntSize(vObjs), vMemObjs._4_4_ < iVar1;
      vMemObjs._4_4_ = vMemObjs._4_4_ + 1) {
    iVar1 = Vec_IntEntry(vObjs,vMemObjs._4_4_);
    pObj_00 = Wlc_NtkObj(p,iVar1);
    iVar1 = Wlc_ObjCheckIsEmpty_rec(p,pObj_00);
    if (iVar1 == 0) {
      iVar1 = Wlc_ObjId(p,pObj_00);
      Vec_IntPush(p_00,iVar1);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Wlc_NtkCleanObjects( Wlc_Ntk_t * p, Vec_Int_t * vObjs )
{
    Wlc_Obj_t * pObj; int i;
    Vec_Int_t * vMemObjs = Vec_IntAlloc( 10 );
    Wlc_NtkSetRefs( p );
    Wlc_NtkForEachObjVec( vObjs, p, pObj, i )
    {
        //printf( "Considering %d (%s)\n", Wlc_ObjId(p, pObj), Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
        if ( !Wlc_ObjCheckIsEmpty_rec(p, pObj) )
            Vec_IntPush( vMemObjs, Wlc_ObjId(p, pObj) );
    }
    return vMemObjs;
}